

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iteratedhash.hpp
# Opt level: O2

void __thiscall
crypto::iterated_hash<crypto::sha1_transform>::update
          (iterated_hash<crypto::sha1_transform> *this,char *data,size_t length)

{
  uint uVar1;
  size_t length_00;
  ulong uVar2;
  iterated_hash<crypto::sha1_transform> *__dest;
  
  uVar1 = this->count_lo;
  this->count_lo = (uint)length + uVar1;
  this->count_hi = this->count_hi + (int)(length >> 0x20) + (uint)CARRY4((uint)length,uVar1);
  uVar2 = (ulong)uVar1 & 0x3f;
  length_00 = length;
  if ((uVar1 & 0x3f) != 0) {
    __dest = (iterated_hash<crypto::sha1_transform> *)(this->buffer + uVar2);
    if (length + uVar2 < 0x40) goto LAB_0012b2b9;
    memcpy((iterated_hash<crypto::sha1_transform> *)(this->buffer + uVar2),data,0x40 - uVar2);
    hash(this->state,this->buffer,0x40);
    data = data + (0x40 - uVar2);
    length_00 = length - (0x40 - uVar2);
  }
  length = length_00;
  if (0x3f < length_00) {
    length = hash(this->state,data,length_00);
    data = data + (length_00 - length);
  }
  __dest = this;
  if (length == 0) {
    return;
  }
LAB_0012b2b9:
  memcpy(__dest,data,length);
  return;
}

Assistant:

void iterated_hash<T>::update(const char * data, size_t length) {
	
	hash_word old_count_lo = count_lo;
	
	if((count_lo = old_count_lo + hash_word(length)) < old_count_lo) {
		count_hi++; // carry from low to high
	}
	
	count_hi += hash_word(util::safe_right_shift<8 * sizeof(hash_word)>(length));
	
	size_t num = util::mod_power_of_2(old_count_lo, size_t(block_size));
	
	if(num != 0) { // process left over data
		if(num + length >= block_size) {
			std::memcpy(buffer + num, data, block_size - num);
			hash(state, buffer, block_size);
			data += (block_size - num);
			length -= (block_size - num);
			// drop through and do the rest
		} else {
			std::memcpy(buffer + num, data, length);
			return;
		}
	}
	
	// now process the input data in blocks of BlockSize bytes and save the leftovers to m_data
	if(length >= block_size) {
		size_t left_over = hash(state, data, length);
		data += (length - left_over);
		length = left_over;
	}
	
	if(length) {
		memcpy(buffer, data, length);
	}
}